

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O0

PktOut * ssh2_userauth_gss_packet(ssh2_userauth_state *s,char *authtype)

{
  int iVar1;
  strbuf *buf_o;
  undefined1 local_48 [8];
  Ssh_gss_buf mic;
  Ssh_gss_buf buf;
  PktOut *p;
  strbuf *sb;
  char *authtype_local;
  ssh2_userauth_state *s_local;
  
  buf_o = strbuf_new();
  BinarySink_put_stringpl(buf_o->binarysink_,s->session_id);
  BinarySink_put_byte(buf_o->binarysink_,'2');
  BinarySink_put_stringz(buf_o->binarysink_,s->username);
  BinarySink_put_stringz(buf_o->binarysink_,s->successor_layer->vt->name);
  BinarySink_put_stringz(buf_o->binarysink_,authtype);
  mic.value = (void *)buf_o->len;
  (*s->shgss->lib->get_mic)
            (s->shgss->lib,s->shgss->ctx,(Ssh_gss_buf *)&mic.value,(Ssh_gss_buf *)local_48);
  strbuf_free(buf_o);
  iVar1 = strcmp(authtype,"gssapi-with-mic");
  if (iVar1 == 0) {
    buf.value = ssh_bpp_new_pktout((s->ppl).bpp,0x42);
  }
  else {
    buf.value = ssh_bpp_new_pktout((s->ppl).bpp,0x32);
    BinarySink_put_stringz(((PktOut *)buf.value)->binarysink_,s->username);
    BinarySink_put_stringz(((PktOut *)buf.value)->binarysink_,s->successor_layer->vt->name);
    BinarySink_put_stringz(((PktOut *)buf.value)->binarysink_,authtype);
  }
  BinarySink_put_string((BinarySink *)((long)buf.value + 0x60),(void *)mic.length,(size_t)local_48);
  return (PktOut *)buf.value;
}

Assistant:

static PktOut *ssh2_userauth_gss_packet(
    struct ssh2_userauth_state *s, const char *authtype)
{
    strbuf *sb;
    PktOut *p;
    Ssh_gss_buf buf;
    Ssh_gss_buf mic;

    /*
     * The mic is computed over the session id + intended
     * USERAUTH_REQUEST packet.
     */
    sb = strbuf_new();
    put_stringpl(sb, s->session_id);
    put_byte(sb, SSH2_MSG_USERAUTH_REQUEST);
    put_stringz(sb, s->username);
    put_stringz(sb, s->successor_layer->vt->name);
    put_stringz(sb, authtype);

    /* Compute the mic */
    buf.value = sb->s;
    buf.length = sb->len;
    s->shgss->lib->get_mic(s->shgss->lib, s->shgss->ctx, &buf, &mic);
    strbuf_free(sb);

    /* Now we can build the real packet */
    if (strcmp(authtype, "gssapi-with-mic") == 0) {
        p = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_USERAUTH_GSSAPI_MIC);
    } else {
        p = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_USERAUTH_REQUEST);
        put_stringz(p, s->username);
        put_stringz(p, s->successor_layer->vt->name);
        put_stringz(p, authtype);
    }
    put_string(p, mic.value, mic.length);

    return p;
}